

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadGridMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  uint startVtx;
  uint lineStride;
  uint resX_in;
  uint resY_in;
  ulong uVar1;
  Ref<embree::XML> this_00;
  size_t sVar2;
  size_type siglen;
  reference pvVar3;
  _Base_ptr in_RDX;
  uchar *sig;
  Grid *in_RSI;
  Node *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  size_t i_5;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> grids;
  size_t i;
  Ref<embree::XML> animation;
  Ref<embree::SceneGraph::GridMeshNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  value_type *in_stack_fffffffffffffad8;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *in_stack_fffffffffffffae0;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffb10;
  XML *in_stack_fffffffffffffb18;
  size_t in_stack_fffffffffffffb58;
  allocator *paVar4;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffb60;
  GridMeshNode *in_stack_fffffffffffffb68;
  BBox1f in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb98;
  XML *in_stack_fffffffffffffba0;
  size_t in_stack_fffffffffffffbc0;
  XML *in_stack_fffffffffffffbc8;
  Ref<embree::XML> *xml_00;
  XMLLoader *this_01;
  Grid local_384;
  ulong local_378;
  allocator local_369;
  string local_368 [32];
  long *local_348;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> local_340;
  allocator local_321;
  string local_320 [16];
  Ref<embree::XML> *in_stack_fffffffffffffcf0;
  XMLLoader *in_stack_fffffffffffffcf8;
  long *local_300;
  _Rb_tree_node_base local_2f8;
  long *local_2d8;
  undefined1 local_2d0 [8];
  ulong local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  ulong local_2b0;
  allocator local_2a1;
  string local_2a0 [32];
  long *local_280;
  undefined1 local_271;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  Ref<embree::XML> *in_stack_fffffffffffffda0;
  SharedState *pSVar5;
  Ref<embree::XML> in_stack_fffffffffffffda8;
  allocator local_239;
  string local_238 [32];
  long *local_218;
  SharedState *local_210;
  _Base_ptr local_208;
  _Base_ptr local_1f0;
  _Base_ptr local_1e8;
  _Base_ptr local_1e0;
  long **local_1d0;
  undefined1 *local_1c8;
  _Rb_tree_node_base *local_1b8;
  long **local_1a8;
  long **local_198;
  long **local_188;
  long **local_178;
  long **local_168;
  undefined4 *local_158;
  undefined4 *local_150;
  undefined4 *local_148;
  long **local_140;
  long **local_138;
  SharedState **local_130;
  XMLLoader *local_128;
  undefined1 *local_120;
  SharedState **local_110;
  XML *local_100;
  Ref<embree::XML> *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_b0;
  _Base_ptr local_90;
  _Rb_tree_node_base *local_88;
  ulong local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  _Rb_tree_node_base *local_20;
  
  local_208 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"material",&local_239);
  XML::child(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  loadMaterial((XMLLoader *)in_stack_fffffffffffffda8.ptr,in_stack_fffffffffffffda0);
  local_1a8 = &local_218;
  if (local_218 != (long *)0x0) {
    (**(code **)(*local_218 + 0x18))();
  }
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  this_00.ptr = (XML *)::operator_new(0xa8);
  local_271 = 1;
  this_01 = (XMLLoader *)&stack0xfffffffffffffda0;
  local_130 = &local_210;
  pSVar5 = local_210;
  local_128 = this_01;
  if (local_210 != (SharedState *)0x0) {
    (**(code **)(*(long *)&(local_210->materialMap)._M_t._M_impl + 0x10))();
  }
  local_26c = 0;
  local_270 = 0x3f800000;
  local_148 = &local_268;
  local_150 = &local_26c;
  local_158 = &local_270;
  local_268 = 0;
  uStack_264 = 0x3f800000;
  SceneGraph::GridMeshNode::GridMeshNode
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb70,
             in_stack_fffffffffffffb58);
  local_271 = 0;
  xml_00 = (Ref<embree::XML> *)&stack0xfffffffffffffda8;
  local_100 = this_00.ptr;
  local_f8 = xml_00;
  if (this_00.ptr != (XML *)0x0) {
    (*(((Node *)&(this_00.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
  }
  local_120 = &stack0xfffffffffffffda0;
  if (pSVar5 != (SharedState *)0x0) {
    (**(code **)(*(long *)&(pSVar5->materialMap)._M_t._M_impl + 0x18))();
  }
  local_1e0 = local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"animated_positions",&local_2a1);
  XML::childOpt(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  local_1d0 = &local_280;
  if (local_280 == (long *)0x0) {
    local_e0 = &stack0xfffffffffffffda8;
    local_1e8 = local_208;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"positions",&local_321);
    XML::childOpt(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
    loadVec3faArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    local_1b8 = &local_2f8;
    for (local_90 = (_Base_ptr)0x0; local_90 < local_2f8._M_parent;
        local_90 = (_Base_ptr)((long)&local_90->_M_color + 1)) {
    }
    local_88 = local_1b8;
    local_20 = local_1b8;
    alignedFree(in_stack_fffffffffffffad8);
    local_2f8._M_right = (_Base_ptr)0x0;
    local_2f8._M_left = (_Base_ptr)0x0;
    local_2f8._M_parent = (_Base_ptr)0x0;
    local_188 = &local_300;
    if (local_300 != (long *)0x0) {
      (**(code **)(*local_300 + 0x18))();
    }
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
  }
  else {
    local_2b0 = 0;
    while( true ) {
      uVar1 = local_2b0;
      local_138 = &local_280;
      sVar2 = XML::size((XML *)0x395344);
      if (sVar2 <= uVar1) break;
      local_d8 = &stack0xfffffffffffffda8;
      local_140 = &local_280;
      XML::child(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      loadVec3faArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      local_1c8 = local_2d0;
      for (local_70 = 0; local_70 < local_2c8; local_70 = local_70 + 1) {
      }
      local_60 = local_2c0;
      local_58 = local_2b8;
      local_68 = local_1c8;
      local_50 = local_1c8;
      alignedFree(in_stack_fffffffffffffad8);
      local_2b8 = 0;
      local_2c0 = 0;
      local_2c8 = 0;
      local_198 = &local_2d8;
      if (local_2d8 != (long *)0x0) {
        (**(code **)(*local_2d8 + 0x18))();
      }
      local_2b0 = local_2b0 + 1;
    }
  }
  local_178 = &local_280;
  if (local_280 != (long *)0x0) {
    (**(code **)(*local_280 + 0x18))();
  }
  local_1f0 = local_208;
  paVar4 = &local_369;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"grids",paVar4);
  XML::childOpt(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  loadVec4iArray(this_01,xml_00);
  local_168 = &local_348;
  if (local_348 != (long *)0x0) {
    (**(code **)(*local_348 + 0x18))();
  }
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  for (local_378 = 0; uVar1 = local_378,
      siglen = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::size(&local_340)
      , uVar1 < siglen; local_378 = local_378 + 1) {
    local_e8 = &stack0xfffffffffffffda8;
    pvVar3 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_340,local_378);
    startVtx = (pvVar3->field_0).field_0.x;
    pvVar3 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_340,local_378);
    lineStride = (pvVar3->field_0).field_0.y;
    pvVar3 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_340,local_378);
    resX_in = (pvVar3->field_0).field_0.z;
    pvVar3 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_340,local_378);
    resY_in = (pvVar3->field_0).field_0.w;
    in_R8 = (uchar *)(ulong)resY_in;
    SceneGraph::GridMeshNode::Grid::Grid(&local_384,startVtx,lineStride,resX_in,resY_in);
    in_RSI = &local_384;
    std::
    vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
    ::push_back(in_stack_fffffffffffffae0,(value_type *)in_stack_fffffffffffffad8);
  }
  local_f0 = &stack0xfffffffffffffda8;
  SceneGraph::GridMeshNode::verify
            ((GridMeshNode *)this_00.ptr,(EVP_PKEY_CTX *)in_RSI,sig,siglen,in_R8,in_R9);
  local_d0 = &stack0xfffffffffffffda8;
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)this_00.ptr;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::~vector
            (in_stack_fffffffffffffaf0);
  local_b0 = &stack0xfffffffffffffda8;
  if (this_00.ptr != (XML *)0x0) {
    (*(((Node *)&(this_00.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  local_110 = &local_210;
  if (local_210 != (SharedState *)0x0) {
    (**(code **)(*(long *)&(local_210->materialMap)._M_t._M_impl + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadGridMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
    }

    std::vector<Vec4i> grids = loadVec4iArray(xml->childOpt("grids"));
    for (size_t i=0; i<grids.size(); i++) 
      mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(grids[i].x,grids[i].y,grids[i].z,grids[i].w));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }